

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionError.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::PositionError::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,PositionError *this)

{
  ostream *poVar1;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  PositionError *local_18;
  PositionError *this_local;
  
  local_18 = this;
  this_local = (PositionError *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"PositionError:\n");
  poVar1 = std::operator<<(poVar1,"\tHorizontal Error: ");
  KFIXED<short,(unsigned_char)8>::GetAsString_abi_cxx11_(&local_1d0,&this->m_HorzErr);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,"\tVertical Error:   ");
  KFIXED<short,(unsigned_char)8>::GetAsString_abi_cxx11_(&local_1f0,&this->m_VertErr);
  std::operator<<(poVar1,(string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString PositionError::GetAsString() const
{
    KStringStream ss;

    ss << "PositionError:\n"
       << "\tHorizontal Error: " << m_HorzErr.GetAsString()
       << "\tVertical Error:   " << m_VertErr.GetAsString();

    return ss.str();
}